

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.h
# Opt level: O1

void __thiscall subprocess::Popen::execute_process(Popen *this)

{
  vector<char_*,_std::allocator<char_*>_> *this_00;
  pointer ppcVar1;
  __pid_t _Var2;
  int iVar3;
  int iVar4;
  pair<int,_int> pVar5;
  FILE *__stream;
  ssize_t sVar6;
  int *piVar7;
  runtime_error *this_01;
  size_t sVar8;
  OSError *this_02;
  undefined1 *__buf;
  pointer unaff_R12;
  int iVar9;
  bool bVar10;
  int __fd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  pointer pbVar11;
  uint uVar12;
  long in_FS_OFFSET;
  char err_buf [1024];
  undefined1 *local_458 [2];
  undefined1 local_448 [16];
  undefined1 local_438 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pVar5 = util::pipe_cloexec();
  if ((this->exe_name_)._M_string_length != 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->vargs_,
             (this->vargs_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&this->exe_name_);
    this_00 = &this->cargv_;
    ppcVar1 = (this->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((this->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar1) {
      (this->cargv_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppcVar1;
    }
    std::vector<char_*,_std::allocator<char_*>_>::reserve
              (this_00,((long)(this->vargs_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->vargs_).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
    pbVar11 = (this->vargs_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    unaff_R12 = (this->vargs_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar11 != unaff_R12) {
      do {
        local_438._0_8_ = (pbVar11->_M_dataplus)._M_p;
        std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                  ((vector<char*,std::allocator<char*>> *)this_00,(char **)local_438);
        pbVar11 = pbVar11 + 1;
      } while (pbVar11 != unaff_R12);
    }
    local_438._0_8_ = (Popen *)0x0;
    std::vector<char*,std::allocator<char*>>::emplace_back<char*>
              ((vector<char*,std::allocator<char*>> *)this_00,(char **)local_438);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&this->exe_name_,
             (this->vargs_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  _Var2 = fork();
  this->child_pid_ = _Var2;
  iVar3 = pVar5.second;
  __fd = pVar5.first;
  if (_Var2 < 0) {
    close(__fd);
    close(iVar3);
    this_02 = (OSError *)__cxa_allocate_exception(0x10);
    local_438._0_8_ = local_438 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"fork failed","");
    piVar7 = __errno_location();
    OSError::OSError(this_02,(string *)local_438,*piVar7);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(this_02,&OSError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (_Var2 == 0) {
      detail::Streams::close_parent_fds(&this->stream_);
      close(__fd);
      local_438._0_8_ = this;
      local_438._8_4_ = iVar3;
      detail::Child::execute_child((Child *)local_438);
    }
    else {
      close(iVar3);
      detail::Streams::close_child_fds(&this->stream_);
      uVar12 = 0;
      memset(local_438,0,0x400);
      __stream = fdopen(__fd,"r");
      iVar3 = fileno(__stream);
      iVar9 = 0;
      do {
        __buf = local_438 + (int)uVar12;
        sVar6 = read(iVar3,__buf,0x400 - (long)(int)uVar12);
        bVar10 = true;
        iVar4 = (int)sVar6;
        if (iVar4 == 0) {
          unaff_R12 = (pointer)(ulong)uVar12;
        }
        else if (iVar4 == -1) {
          piVar7 = __errno_location();
          if (iVar9 < 0x32 && *piVar7 == 4) {
            iVar9 = iVar9 + 1;
            bVar10 = false;
          }
          else {
            unaff_R12 = (pointer)0xffffffff;
          }
        }
        else {
          uVar12 = uVar12 + iVar4;
          bVar10 = false;
        }
      } while (!bVar10);
      close(__fd);
      if (((int)unaff_R12 != 0) || (local_438[0] != (string)0x0)) {
        _Var2 = wait(this,__buf);
        this_01 = (runtime_error *)__cxa_allocate_exception(0x18);
        local_458[0] = local_448;
        sVar8 = strlen(local_438);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_458,local_438,local_438 + sVar8);
        std::runtime_error::runtime_error(this_01,(string *)local_458);
        *(undefined ***)this_01 = &PTR__runtime_error_006c14e8;
        *(__pid_t *)(this_01 + 0x10) = _Var2;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_01,&CalledProcessError::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_003f4f9a;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
LAB_003f4f9a:
  __stack_chk_fail();
}

Assistant:

inline void Popen::execute_process() noexcept(false)
{
#ifdef __USING_WINDOWS__
  if (exe_name_.length()) {
    this->vargs_.insert(this->vargs_.begin(), this->exe_name_);
    this->populate_c_argv();
  }
  this->exe_name_ = vargs_[0];

  std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>> converter;
  std::wstring argument;
  std::wstring command_line;

  for (auto arg : this->vargs_) {
    argument = converter.from_bytes(arg);
    util::quote_argument(argument, command_line, false);
    command_line += L" ";
  }

  // CreateProcessW can modify szCmdLine so we allocate needed memory
  wchar_t *szCmdline = new wchar_t[command_line.size() + 1];
  wcscpy_s(szCmdline, command_line.size() + 1, command_line.c_str());
  PROCESS_INFORMATION piProcInfo;
  STARTUPINFOW siStartInfo;
  BOOL bSuccess = FALSE;
  DWORD creation_flags = CREATE_UNICODE_ENVIRONMENT | CREATE_NO_WINDOW;

  // Set up members of the PROCESS_INFORMATION structure.
  ZeroMemory(&piProcInfo, sizeof(PROCESS_INFORMATION));

  // Set up members of the STARTUPINFOW structure.
  // This structure specifies the STDIN and STDOUT handles for redirection.

  ZeroMemory(&siStartInfo, sizeof(STARTUPINFOW));
  siStartInfo.cb = sizeof(STARTUPINFOW);

  siStartInfo.hStdError = this->stream_.g_hChildStd_ERR_Wr;
  siStartInfo.hStdOutput = this->stream_.g_hChildStd_OUT_Wr;
  siStartInfo.hStdInput = this->stream_.g_hChildStd_IN_Rd;

  siStartInfo.dwFlags |= STARTF_USESTDHANDLES;

  // Create the child process.
  bSuccess = CreateProcessW(NULL,
                            szCmdline,    // command line
                            NULL,         // process security attributes
                            NULL,         // primary thread security attributes
                            TRUE,         // handles are inherited
                            creation_flags,	// creation flags
                            NULL,         // use parent's environment
                            NULL,         // use parent's current directory
                            &siStartInfo, // STARTUPINFOW pointer
                            &piProcInfo); // receives PROCESS_INFORMATION

  // If an error occurs, exit the application.
  if (!bSuccess) {
    DWORD errorMessageID = ::GetLastError();
    throw CalledProcessError("CreateProcess failed: " + util::get_last_error(errorMessageID), errorMessageID);
  }

  CloseHandle(piProcInfo.hThread);

  /*
    TODO: use common apis to close linux handles
  */

  this->process_handle_ = piProcInfo.hProcess;

  this->cleanup_future_ = std::async(std::launch::async, [this] {
    WaitForSingleObject(this->process_handle_, INFINITE);

    CloseHandle(this->stream_.g_hChildStd_ERR_Wr);
    CloseHandle(this->stream_.g_hChildStd_OUT_Wr);
    CloseHandle(this->stream_.g_hChildStd_IN_Rd);
  });

/*
  NOTE: In the linux version, there is a check to make sure that the process
        has been started. Here, we do nothing because CreateProcess will throw
        if we fail to create the process.
*/


#else

  int err_rd_pipe, err_wr_pipe;
  std::tie(err_rd_pipe, err_wr_pipe) = util::pipe_cloexec();

  if (exe_name_.length()) {
    vargs_.insert(vargs_.begin(), exe_name_);
    populate_c_argv();
  }
  exe_name_ = vargs_[0];

  child_pid_ = fork();

  if (child_pid_ < 0) {
    close(err_rd_pipe);
    close(err_wr_pipe);
    throw OSError("fork failed", errno);
  }

  if (child_pid_ == 0)
  {
    // Close descriptors belonging to parent
    stream_.close_parent_fds();

    //Close the read end of the error pipe
    close(err_rd_pipe);

    detail::Child chld(this, err_wr_pipe);
    chld.execute_child();
  }
  else
  {
    close (err_wr_pipe);// close child side of pipe, else get stuck in read below

    stream_.close_child_fds();

    try {
      char err_buf[SP_MAX_ERR_BUF_SIZ] = {0,};

      int read_bytes = util::read_atmost_n(
                                  fdopen(err_rd_pipe, "r"),
                                  err_buf,
                                  SP_MAX_ERR_BUF_SIZ);
      close(err_rd_pipe);

      if (read_bytes || strlen(err_buf)) {
        // Call waitpid to reap the child process
        // waitpid suspends the calling process until the
        // child terminates.
        int retcode = wait();

        // Throw whatever information we have about child failure
        throw CalledProcessError(err_buf, retcode);
      }
    } catch (std::exception& exp) {
      stream_.cleanup_fds();
      throw;
    }

  }
#endif
}